

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * scantxoutset(void)

{
  long lVar1;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string cond;
  string name;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string m_key_name_15;
  string description_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_16;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> results_00;
  _Alloc_hider in_stack_ffffffffffffe848;
  undefined1 in_stack_ffffffffffffe850 [24];
  undefined8 in_stack_ffffffffffffe868;
  undefined8 in_stack_ffffffffffffe870;
  _Manager_type in_stack_ffffffffffffe878;
  undefined8 in_stack_ffffffffffffe880;
  undefined1 in_stack_ffffffffffffe888 [16];
  pointer in_stack_ffffffffffffe898;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer in_stack_ffffffffffffe8b0;
  pointer pRVar6;
  pointer pRVar7;
  pointer pRVar8;
  undefined8 in_stack_ffffffffffffe8d0;
  pointer pRVar9;
  pointer pRVar10;
  pointer pRVar11;
  _Invoker_type in_stack_ffffffffffffe8f0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1708;
  allocator<char> local_16ea;
  allocator<char> local_16e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16e8;
  allocator<char> local_16ca;
  allocator<char> local_16c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16c8;
  allocator<char> local_16a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_16a8;
  allocator<char> local_168a;
  allocator<char> local_1689;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1688;
  allocator<char> local_166a;
  allocator<char> local_1669;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1668;
  allocator<char> local_164a;
  allocator<char> local_1649;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1648;
  allocator<char> local_162a;
  allocator<char> local_1629;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1628;
  allocator<char> local_160a;
  allocator<char> local_1609;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1608;
  allocator<char> local_15ea;
  allocator<char> local_15e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15e8;
  allocator<char> local_15ca;
  allocator<char> local_15c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15c8;
  allocator<char> local_15aa;
  allocator<char> local_15a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_15a8;
  allocator<char> local_158a;
  allocator<char> local_1589;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1588;
  allocator<char> local_156a;
  allocator<char> local_1569;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1568;
  allocator<char> local_154b;
  allocator<char> local_154a;
  allocator<char> local_1549;
  RPCResults local_1548;
  allocator_type local_1529;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1528;
  allocator<char> local_150a;
  allocator<char> local_1509;
  string local_1508;
  string local_14e8;
  string local_14c8;
  string local_14a8;
  string local_1488;
  string local_1468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  string local_1408;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  string local_1388;
  string local_1368;
  string local_1348;
  string local_1328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e8;
  string local_12c8;
  string local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1208;
  char *local_11e8;
  size_type local_11e0;
  char local_11d8 [8];
  undefined8 uStack_11d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  string local_11a8 [32];
  string local_1188 [32];
  string local_1168 [32];
  string local_1148 [32];
  string local_1128 [32];
  string local_1108 [32];
  string local_10e8 [32];
  string local_10c8 [32];
  string local_10a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1088;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1068;
  string local_1048 [24];
  undefined8 local_1030;
  string local_1028 [32];
  string local_1008 [32];
  string local_fe8 [32];
  string local_fc8 [32];
  string local_fa8 [32];
  string local_f88 [32];
  string local_f68 [32];
  string local_f48 [32];
  RPCResult local_f28 [4];
  RPCResult local_d08;
  RPCResult local_c80;
  RPCResult local_bf8;
  RPCResult local_b70;
  RPCResult local_ae8;
  string local_a60 [32];
  string local_a40 [32];
  RPCResult local_a20;
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  RPCResult local_858 [4];
  RPCResult local_638;
  RPCResult local_5b0;
  string local_528 [32];
  string local_508 [32];
  string local_4e8 [32];
  RPCResult local_4c8 [4];
  RPCArg local_2a8 [2];
  string local_98 [32];
  string local_78 [32];
  string EXAMPLE_DESCRIPTOR_RAW;
  
  local_1030 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&EXAMPLE_DESCRIPTOR_RAW,
             "raw(76a91411b366edfc0a8b66feebae5c2e25a7b6a5d1cf3188ac)#fm24fxxy",
             (allocator<char> *)local_f28);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"scantxoutset",&local_1509);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,
             "\nScans the unspent transaction output set for entries that match certain output descriptors.\nExamples of output descriptors are:\n    addr(<address>)                      Outputs whose output script corresponds to the specified address (does not include P2PK)\n    raw(<hex script>)                    Outputs whose output script equals the specified hex-encoded bytes\n    combo(<pubkey>)                      P2PK, P2PKH, P2WPKH, and P2SH-P2WPKH outputs for the given pubkey\n    pkh(<pubkey>)                        P2PKH outputs for the given pubkey\n    sh(multi(<n>,<pubkey>,<pubkey>,...)) P2SH-multisig outputs for the given threshold and pubkeys\n    tr(<pubkey>)                         P2TR\n    tr(<pubkey>,{pk(<pubkey>)})          P2TR with single fallback pubkey in tapscript\n    rawtr(<pubkey>)                      P2TR with the specified key as output key rather than inner\n    wsh(and_v(v:pk(<pubkey>),after(2)))  P2WSH miniscript with mandatory pubkey and a timelock\n\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\nor more path elements separated by \"/\", and optionally ending in \"/*\" (unhardened), or \"/*\'\" or \"/*h\" (hardened) to specify all\nunhardened or hardened child keys.\nIn the latter case, a range needs to be specified by below if different from 1000.\nFor more information on output descriptors, see the documentation in the doc/descriptors.md file.\n"
             ,&local_150a);
  RPCArg::RPCArg(local_2a8,&scan_action_arg_desc);
  RPCArg::RPCArg(local_2a8 + 1,&scan_objects_arg_desc);
  __l._M_len = 2;
  __l._M_array = local_2a8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_1528,__l,&local_1529);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e8,"when action==\'start\'; only returns after scan completes",&local_1549);
  std::__cxx11::string::string<std::allocator<char>>(local_508,"",&local_154a);
  std::__cxx11::string::string<std::allocator<char>>(local_528,"",&local_154b);
  std::__cxx11::string::string<std::allocator<char>>(local_878,"success",&local_1569);
  std::__cxx11::string::string<std::allocator<char>>
            (local_898,"Whether the scan was completed",&local_156a);
  local_1588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description._M_string_length = in_stack_ffffffffffffe870;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffe898;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(local_858,BOOL,m_key_name,description,inner,SUB81(local_878,0));
  std::__cxx11::string::string<std::allocator<char>>(local_8b8,"txouts",&local_1589);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8d8,"The number of unspent transaction outputs scanned",&local_158a);
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_00._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_00._M_string_length = in_stack_ffffffffffffe870;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_00.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(local_858 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_8b8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_8f8,"height",&local_15a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_918,"The block height at which the scan was done",&local_15aa);
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_01._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_01._M_string_length = in_stack_ffffffffffffe870;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_01.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(local_858 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_8f8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_938,"bestblock",&local_15c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_958,"The hash of the block at the tip of the chain",&local_15ca);
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_02._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_02._M_string_length = in_stack_ffffffffffffe870;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_02.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult
            (local_858 + 3,STR_HEX,m_key_name_02,description_02,inner_02,SUB81(local_938,0));
  std::__cxx11::string::string<std::allocator<char>>(local_978,"unspents",&local_15e9);
  std::__cxx11::string::string<std::allocator<char>>(local_998,"",&local_15ea);
  std::__cxx11::string::string<std::allocator<char>>(local_a40,"",&local_1609);
  std::__cxx11::string::string<std::allocator<char>>(local_a60,"",&local_160a);
  std::__cxx11::string::string<std::allocator<char>>(local_f48,"txid",&local_1629);
  std::__cxx11::string::string<std::allocator<char>>(local_f68,"The transaction id",&local_162a);
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1648.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_03._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_03._M_string_length = in_stack_ffffffffffffe870;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_03.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(local_f28,STR_HEX,m_key_name_03,description_03,inner_03,SUB81(local_f48,0));
  std::__cxx11::string::string<std::allocator<char>>(local_f88,"vout",&local_1649);
  std::__cxx11::string::string<std::allocator<char>>(local_fa8,"The vout value",&local_164a);
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1668.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_04._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_04._M_string_length = in_stack_ffffffffffffe870;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_04.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(local_f28 + 1,NUM,m_key_name_04,description_04,inner_04,SUB81(local_f88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_fc8,"scriptPubKey",&local_1669);
  std::__cxx11::string::string<std::allocator<char>>(local_fe8,"The output script",&local_166a);
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_05._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_05._M_string_length = in_stack_ffffffffffffe870;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_05.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult
            (local_f28 + 2,STR_HEX,m_key_name_05,description_05,inner_05,SUB81(local_fc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1008,"desc",&local_1689);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1028,"A specialized descriptor for the matched output script",&local_168a);
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_06._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_06._M_string_length = in_stack_ffffffffffffe870;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_06.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(local_f28 + 3,STR,m_key_name_06,description_06,inner_06,SUB81(local_1008,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1048,"amount",&local_16a9);
  std::operator+(&local_1088,"The total amount in ",&CURRENCY_UNIT_abi_cxx11_);
  std::operator+(&local_1068,&local_1088," of the unspent output");
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_07._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_07._M_string_length = in_stack_ffffffffffffe870;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_07.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult
            (&local_d08,STR_AMOUNT,m_key_name_07,description_07,inner_07,SUB81(local_1048,0));
  std::__cxx11::string::string<std::allocator<char>>(local_10a8,"coinbase",&local_16c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10c8,"Whether this is a coinbase output",&local_16ca);
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_08._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_08._M_string_length = in_stack_ffffffffffffe870;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_08.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(&local_c80,BOOL,m_key_name_08,description_08,inner_08,SUB81(local_10a8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_10e8,"height",&local_16e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1108,"Height of the unspent transaction output",&local_16ea);
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1708.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_09.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_09._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_09._M_string_length = in_stack_ffffffffffffe870;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_09.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(&local_bf8,NUM,m_key_name_09,description_09,inner_09,SUB81(local_10e8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1128,"blockhash",(allocator<char> *)&stack0xffffffffffffe8f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1148,"Blockhash of the unspent transaction output",
             (allocator<char> *)&stack0xffffffffffffe8f6);
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_10._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_10.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_10._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_10._M_string_length = in_stack_ffffffffffffe870;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_10.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(&local_b70,STR_HEX,m_key_name_10,description_10,inner_10,SUB81(local_1128,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1168,"confirmations",(allocator<char> *)&stack0xffffffffffffe8d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1188,
             "Number of confirmations of the unspent transaction output when the scan was done",
             (allocator<char> *)&stack0xffffffffffffe8d6);
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  m_key_name_11._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_11.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_11._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_11._M_string_length = in_stack_ffffffffffffe870;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_11.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(&local_ae8,NUM,m_key_name_11,description_11,inner_11,SUB81(local_1168,0));
  __l_00._M_len = 9;
  __l_00._M_array = local_f28;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1628,__l_00,(allocator_type *)&stack0xffffffffffffe8b7);
  m_key_name_12._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_12.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_12._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_12._M_string_length = in_stack_ffffffffffffe870;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_12.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(&local_a20,OBJ,m_key_name_12,description_12,inner_12,SUB81(local_a40,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_a20;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1608,__l_01,(allocator_type *)&stack0xffffffffffffe8b6);
  m_key_name_13._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_13.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_13._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_13._M_string_length = in_stack_ffffffffffffe870;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_13.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffe898;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult(&local_638,ARR,m_key_name_13,description_13,inner_13,SUB81(local_978,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_11a8,"total_amount",(allocator<char> *)&stack0xffffffffffffe8b5);
  std::operator+(&local_11c8,"The total amount of all found unspent outputs in ",
                 &CURRENCY_UNIT_abi_cxx11_);
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  m_key_name_14._M_string_length = in_stack_ffffffffffffe850._0_8_;
  m_key_name_14.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffe850._8_16_;
  m_key_name_14._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  description_14._M_string_length = in_stack_ffffffffffffe870;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  description_14.field_2._8_8_ = in_stack_ffffffffffffe880;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffe888._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffe888._8_8_;
  RPCResult::RPCResult
            (&local_5b0,STR_AMOUNT,m_key_name_14,description_14,inner_14,SUB81(local_11a8,0));
  __l_02._M_len = 6;
  __l_02._M_array = local_858;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1568,__l_02,(allocator_type *)&stack0xffffffffffffe897);
  cond._M_string_length = in_stack_ffffffffffffe850._0_8_;
  cond.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffe850._8_16_;
  cond._M_dataplus._M_p = in_stack_ffffffffffffe848._M_p;
  m_key_name_15._M_string_length = in_stack_ffffffffffffe870;
  m_key_name_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe868;
  m_key_name_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffe878;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffe880;
  description_16.field_2._M_allocated_capacity = (size_type)pRVar3;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffe888._0_8_;
  description_16._M_string_length = in_stack_ffffffffffffe888._8_8_;
  description_16.field_2._8_8_ = pRVar4;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffe8b0;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar6;
  RPCResult::RPCResult(local_4c8,cond,(Type)local_4e8,m_key_name_15,description_16,inner_15);
  RPCResult::RPCResult(local_4c8 + 1,&scan_result_abort);
  RPCResult::RPCResult(local_4c8 + 2,&scan_result_status_some);
  RPCResult::RPCResult(local_4c8 + 3,&scan_result_status_none);
  results_00._M_len = 4;
  results_00._M_array = local_4c8;
  RPCResults::RPCResults(&local_1548,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_12c8,"scantxoutset",(allocator<char> *)&stack0xffffffffffffe896);
  std::operator+(&local_1308,"start \'[\"",&EXAMPLE_DESCRIPTOR_RAW);
  std::operator+(&local_12e8,&local_1308,"\"]\'");
  HelpExampleCli(&local_12a8,&local_12c8,&local_12e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1348,"scantxoutset",(allocator<char> *)&stack0xffffffffffffe895);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1368,"status",(allocator<char> *)&stack0xffffffffffffe894);
  HelpExampleCli(&local_1328,&local_1348,&local_1368);
  std::operator+(&local_1288,&local_12a8,&local_1328);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13a8,"scantxoutset",(allocator<char> *)&stack0xffffffffffffe893);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_13c8,"abort",(allocator<char> *)&stack0xffffffffffffe892);
  HelpExampleCli(&local_1388,&local_13a8,&local_13c8);
  std::operator+(&local_1268,&local_1288,&local_1388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1408,"scantxoutset",(allocator<char> *)&stack0xffffffffffffe891);
  std::operator+(&local_1448,"\"start\", [\"",&EXAMPLE_DESCRIPTOR_RAW);
  std::operator+(&local_1428,&local_1448,"\"]");
  HelpExampleRpc(&local_13e8,&local_1408,&local_1428);
  std::operator+(&local_1248,&local_1268,&local_13e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1488,"scantxoutset",(allocator<char> *)&stack0xffffffffffffe890);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14a8,"\"status\"",(allocator<char> *)&stack0xffffffffffffe88f);
  HelpExampleRpc(&local_1468,&local_1488,&local_14a8);
  std::operator+(&local_1228,&local_1248,&local_1468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_14e8,"scantxoutset",(allocator<char> *)&stack0xffffffffffffe88e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1508,"\"abort\"",(allocator<char> *)&stack0xffffffffffffe88d);
  HelpExampleRpc(&local_14c8,&local_14e8,&local_1508);
  std::operator+(&local_1208,&local_1228,&local_14c8);
  local_11e8 = local_11d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1208._M_dataplus._M_p == &local_1208.field_2) {
    uStack_11d0 = local_1208.field_2._8_8_;
  }
  else {
    local_11e8 = local_1208._M_dataplus._M_p;
  }
  local_11e0 = local_1208._M_string_length;
  local_1208._M_string_length = 0;
  local_1208.field_2._M_local_buf[0] = '\0';
  name._M_string_length = in_stack_ffffffffffffe850._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffe850._8_16_;
  name._M_dataplus._M_p = &stack0xffffffffffffe868;
  description_15.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2248:9)>
       ::_M_manager;
  description_15._M_dataplus._M_p = (pointer)0x0;
  description_15._M_string_length = 0;
  description_15.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:2248:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffe888._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffe888._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffe8b0;
  examples.m_examples._M_string_length = (size_type)pRVar7;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar6;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffe8d0;
  fun.super__Function_base._M_functor._8_8_ = pRVar10;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar9;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun._M_invoker = in_stack_ffffffffffffe8f0;
  local_1208._M_dataplus._M_p = (pointer)&local_1208.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name,description_15,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffe868);
  std::__cxx11::string::~string((string *)&local_11e8);
  std::__cxx11::string::~string((string *)&local_1208);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::~string((string *)&local_1508);
  std::__cxx11::string::~string((string *)&local_14e8);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string((string *)&local_1468);
  std::__cxx11::string::~string((string *)&local_14a8);
  std::__cxx11::string::~string((string *)&local_1488);
  std::__cxx11::string::~string((string *)&local_1248);
  std::__cxx11::string::~string((string *)&local_13e8);
  std::__cxx11::string::~string((string *)&local_1428);
  std::__cxx11::string::~string((string *)&local_1448);
  std::__cxx11::string::~string((string *)&local_1408);
  std::__cxx11::string::~string((string *)&local_1268);
  std::__cxx11::string::~string((string *)&local_1388);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::__cxx11::string::~string((string *)&local_13a8);
  std::__cxx11::string::~string((string *)&local_1288);
  std::__cxx11::string::~string((string *)&local_1328);
  std::__cxx11::string::~string((string *)&local_1368);
  std::__cxx11::string::~string((string *)&local_1348);
  std::__cxx11::string::~string((string *)&local_12a8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::~string((string *)&local_1308);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1548.m_results);
  lVar2 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_4c8[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1568);
  lVar2 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_858[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe898);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::__cxx11::string::~string(local_11a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1608);
  RPCResult::~RPCResult(&local_a20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1628);
  lVar2 = 0x440;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_f28[0].m_type + lVar2));
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8b8);
  std::__cxx11::string::~string(local_1188);
  std::__cxx11::string::~string(local_1168);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffe8d8);
  std::__cxx11::string::~string(local_1148);
  std::__cxx11::string::~string(local_1128);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1708);
  std::__cxx11::string::~string(local_1108);
  std::__cxx11::string::~string(local_10e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16e8);
  std::__cxx11::string::~string(local_10c8);
  std::__cxx11::string::~string(local_10a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16c8);
  std::__cxx11::string::~string((string *)&local_1068);
  std::__cxx11::string::~string((string *)&local_1088);
  std::__cxx11::string::~string(local_1048);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_16a8);
  std::__cxx11::string::~string(local_1028);
  std::__cxx11::string::~string(local_1008);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1688);
  std::__cxx11::string::~string(local_fe8);
  std::__cxx11::string::~string(local_fc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1668);
  std::__cxx11::string::~string(local_fa8);
  std::__cxx11::string::~string(local_f88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1648);
  std::__cxx11::string::~string(local_f68);
  std::__cxx11::string::~string(local_f48);
  std::__cxx11::string::~string(local_a60);
  std::__cxx11::string::~string(local_a40);
  std::__cxx11::string::~string(local_998);
  std::__cxx11::string::~string(local_978);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15e8);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_938);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15c8);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_8f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_15a8);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_8b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1588);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_878);
  std::__cxx11::string::~string(local_528);
  std::__cxx11::string::~string(local_508);
  std::__cxx11::string::~string(local_4e8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1528);
  lVar2 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_2a8[0].m_names._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x108;
  } while (lVar2 != -0x108);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&EXAMPLE_DESCRIPTOR_RAW);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan scantxoutset()
{
    // raw() descriptor corresponding to mainnet address 12cbQLTFMXRnSzktFkuoG3eHoMeFtpTu3S
    const std::string EXAMPLE_DESCRIPTOR_RAW = "raw(76a91411b366edfc0a8b66feebae5c2e25a7b6a5d1cf3188ac)#fm24fxxy";

    return RPCHelpMan{"scantxoutset",
        "\nScans the unspent transaction output set for entries that match certain output descriptors.\n"
        "Examples of output descriptors are:\n"
        "    addr(<address>)                      Outputs whose output script corresponds to the specified address (does not include P2PK)\n"
        "    raw(<hex script>)                    Outputs whose output script equals the specified hex-encoded bytes\n"
        "    combo(<pubkey>)                      P2PK, P2PKH, P2WPKH, and P2SH-P2WPKH outputs for the given pubkey\n"
        "    pkh(<pubkey>)                        P2PKH outputs for the given pubkey\n"
        "    sh(multi(<n>,<pubkey>,<pubkey>,...)) P2SH-multisig outputs for the given threshold and pubkeys\n"
        "    tr(<pubkey>)                         P2TR\n"
        "    tr(<pubkey>,{pk(<pubkey>)})          P2TR with single fallback pubkey in tapscript\n"
        "    rawtr(<pubkey>)                      P2TR with the specified key as output key rather than inner\n"
        "    wsh(and_v(v:pk(<pubkey>),after(2)))  P2WSH miniscript with mandatory pubkey and a timelock\n"
        "\nIn the above, <pubkey> either refers to a fixed public key in hexadecimal notation, or to an xpub/xprv optionally followed by one\n"
        "or more path elements separated by \"/\", and optionally ending in \"/*\" (unhardened), or \"/*'\" or \"/*h\" (hardened) to specify all\n"
        "unhardened or hardened child keys.\n"
        "In the latter case, a range needs to be specified by below if different from 1000.\n"
        "For more information on output descriptors, see the documentation in the doc/descriptors.md file.\n",
        {
            scan_action_arg_desc,
            scan_objects_arg_desc,
        },
        {
            RPCResult{"when action=='start'; only returns after scan completes", RPCResult::Type::OBJ, "", "", {
                {RPCResult::Type::BOOL, "success", "Whether the scan was completed"},
                {RPCResult::Type::NUM, "txouts", "The number of unspent transaction outputs scanned"},
                {RPCResult::Type::NUM, "height", "The block height at which the scan was done"},
                {RPCResult::Type::STR_HEX, "bestblock", "The hash of the block at the tip of the chain"},
                {RPCResult::Type::ARR, "unspents", "",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "txid", "The transaction id"},
                        {RPCResult::Type::NUM, "vout", "The vout value"},
                        {RPCResult::Type::STR_HEX, "scriptPubKey", "The output script"},
                        {RPCResult::Type::STR, "desc", "A specialized descriptor for the matched output script"},
                        {RPCResult::Type::STR_AMOUNT, "amount", "The total amount in " + CURRENCY_UNIT + " of the unspent output"},
                        {RPCResult::Type::BOOL, "coinbase", "Whether this is a coinbase output"},
                        {RPCResult::Type::NUM, "height", "Height of the unspent transaction output"},
                        {RPCResult::Type::STR_HEX, "blockhash", "Blockhash of the unspent transaction output"},
                        {RPCResult::Type::NUM, "confirmations", "Number of confirmations of the unspent transaction output when the scan was done"},
                    }},
                }},
                {RPCResult::Type::STR_AMOUNT, "total_amount", "The total amount of all found unspent outputs in " + CURRENCY_UNIT},
            }},
            scan_result_abort,
            scan_result_status_some,
            scan_result_status_none,
        },
        RPCExamples{
            HelpExampleCli("scantxoutset", "start \'[\"" + EXAMPLE_DESCRIPTOR_RAW + "\"]\'") +
            HelpExampleCli("scantxoutset", "status") +
            HelpExampleCli("scantxoutset", "abort") +
            HelpExampleRpc("scantxoutset", "\"start\", [\"" + EXAMPLE_DESCRIPTOR_RAW + "\"]") +
            HelpExampleRpc("scantxoutset", "\"status\"") +
            HelpExampleRpc("scantxoutset", "\"abort\"")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    UniValue result(UniValue::VOBJ);
    const auto action{self.Arg<std::string>("action")};
    if (action == "status") {
        CoinsViewScanReserver reserver;
        if (reserver.reserve()) {
            // no scan in progress
            return UniValue::VNULL;
        }
        result.pushKV("progress", g_scan_progress.load());
        return result;
    } else if (action == "abort") {
        CoinsViewScanReserver reserver;
        if (reserver.reserve()) {
            // reserve was possible which means no scan was running
            return false;
        }
        // set the abort flag
        g_should_abort_scan = true;
        return true;
    } else if (action == "start") {
        CoinsViewScanReserver reserver;
        if (!reserver.reserve()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Scan already in progress, use action \"abort\" or \"status\"");
        }

        if (request.params.size() < 2) {
            throw JSONRPCError(RPC_MISC_ERROR, "scanobjects argument is required for the start action");
        }

        std::set<CScript> needles;
        std::map<CScript, std::string> descriptors;
        CAmount total_in = 0;

        // loop through the scan objects
        for (const UniValue& scanobject : request.params[1].get_array().getValues()) {
            FlatSigningProvider provider;
            auto scripts = EvalDescriptorStringOrObject(scanobject, provider);
            for (CScript& script : scripts) {
                std::string inferred = InferDescriptor(script, provider)->ToString();
                needles.emplace(script);
                descriptors.emplace(std::move(script), std::move(inferred));
            }
        }

        // Scan the unspent transaction output set for inputs
        UniValue unspents(UniValue::VARR);
        std::vector<CTxOut> input_txos;
        std::map<COutPoint, Coin> coins;
        g_should_abort_scan = false;
        int64_t count = 0;
        std::unique_ptr<CCoinsViewCursor> pcursor;
        const CBlockIndex* tip;
        NodeContext& node = EnsureAnyNodeContext(request.context);
        {
            ChainstateManager& chainman = EnsureChainman(node);
            LOCK(cs_main);
            Chainstate& active_chainstate = chainman.ActiveChainstate();
            active_chainstate.ForceFlushStateToDisk();
            pcursor = CHECK_NONFATAL(active_chainstate.CoinsDB().Cursor());
            tip = CHECK_NONFATAL(active_chainstate.m_chain.Tip());
        }
        bool res = FindScriptPubKey(g_scan_progress, g_should_abort_scan, count, pcursor.get(), needles, coins, node.rpc_interruption_point);
        result.pushKV("success", res);
        result.pushKV("txouts", count);
        result.pushKV("height", tip->nHeight);
        result.pushKV("bestblock", tip->GetBlockHash().GetHex());

        for (const auto& it : coins) {
            const COutPoint& outpoint = it.first;
            const Coin& coin = it.second;
            const CTxOut& txo = coin.out;
            const CBlockIndex& coinb_block{*CHECK_NONFATAL(tip->GetAncestor(coin.nHeight))};
            input_txos.push_back(txo);
            total_in += txo.nValue;

            UniValue unspent(UniValue::VOBJ);
            unspent.pushKV("txid", outpoint.hash.GetHex());
            unspent.pushKV("vout", outpoint.n);
            unspent.pushKV("scriptPubKey", HexStr(txo.scriptPubKey));
            unspent.pushKV("desc", descriptors[txo.scriptPubKey]);
            unspent.pushKV("amount", ValueFromAmount(txo.nValue));
            unspent.pushKV("coinbase", coin.IsCoinBase());
            unspent.pushKV("height", coin.nHeight);
            unspent.pushKV("blockhash", coinb_block.GetBlockHash().GetHex());
            unspent.pushKV("confirmations", tip->nHeight - coin.nHeight + 1);

            unspents.push_back(std::move(unspent));
        }
        result.pushKV("unspents", std::move(unspents));
        result.pushKV("total_amount", ValueFromAmount(total_in));
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid action '%s'", action));
    }
    return result;
},
    };
}